

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader15.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader15::begin__transparent
          (LibraryEffectsLoader15 *this,transparent__AttributeData *attributeData)

{
  ulong uVar1;
  int iVar2;
  ulong in_RAX;
  transparent__AttributeData attrData;
  undefined8 uStack_8;
  
  uStack_8._0_4_ = (undefined4)in_RAX;
  uVar1 = in_RAX;
  switch(attributeData->opaque) {
  case ENUM__fx_opaque_enum__A_ONE:
    uStack_8 = in_RAX & 0xffffffff;
    uVar1 = uStack_8;
    break;
  case ENUM__fx_opaque_enum__A_ZERO:
    uStack_8 = CONCAT44(1,(undefined4)uStack_8);
    uVar1 = uStack_8;
    break;
  case ENUM__fx_opaque_enum__RGB_ONE:
    uStack_8 = CONCAT44(2,(undefined4)uStack_8);
    uVar1 = uStack_8;
    break;
  case ENUM__fx_opaque_enum__RGB_ZERO:
    uStack_8 = CONCAT44(3,(undefined4)uStack_8);
    uVar1 = uStack_8;
    break;
  case ENUM__fx_opaque_enum__COUNT:
    uStack_8 = CONCAT44(4,(undefined4)uStack_8);
    uVar1 = uStack_8;
    break;
  case ENUM__fx_opaque_enum__NOT_PRESENT:
    uStack_8 = CONCAT44(5,(undefined4)uStack_8);
    uVar1 = uStack_8;
  }
  uStack_8 = uVar1;
  iVar2 = (*(this->mLoader->super_LibraryImagesLoader).super_FilePartLoader.super_IFilePartLoader.
            super_ExtraDataLoader._vptr_ExtraDataLoader[0x49])(this->mLoader,(long)&uStack_8 + 4);
  return SUB41(iVar2,0);
}

Assistant:

bool LibraryEffectsLoader15::begin__transparent( const COLLADASaxFWL15::transparent__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__transparent(attributeData));
COLLADASaxFWL::transparent__AttributeData attrData;
switch (attributeData.opaque) {
case COLLADASaxFWL15::ENUM__fx_opaque_enum__A_ONE: attrData.opaque=COLLADASaxFWL::ENUM__fx_opaque__A_ONE; break;
case COLLADASaxFWL15::ENUM__fx_opaque_enum__A_ZERO: attrData.opaque=COLLADASaxFWL::ENUM__fx_opaque__A_ZERO; break;
case COLLADASaxFWL15::ENUM__fx_opaque_enum__RGB_ONE: attrData.opaque=COLLADASaxFWL::ENUM__fx_opaque__RGB_ONE; break;
case COLLADASaxFWL15::ENUM__fx_opaque_enum__RGB_ZERO: attrData.opaque=COLLADASaxFWL::ENUM__fx_opaque__RGB_ZERO; break;
case COLLADASaxFWL15::ENUM__fx_opaque_enum__COUNT: attrData.opaque=COLLADASaxFWL::ENUM__fx_opaque__INVALID; break;
case COLLADASaxFWL15::ENUM__fx_opaque_enum__NOT_PRESENT: attrData.opaque=COLLADASaxFWL::ENUM__fx_opaque__NOT_PRESENT; break;
}
return mLoader->begin__transparent(attrData);
}